

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
OneofOnlySetLast<proto2_unittest::TestAllTypes>::TestBody
          (OneofOnlySetLast<proto2_unittest::TestAllTypes> *this)

{
  DescriptorPool *pDVar1;
  DescriptorPool *pDVar2;
  bool bVar3;
  size_t sVar4;
  uint8_t *ptr;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_2;
  internal iVar5;
  string_view value;
  int size;
  StringOutputStream raw_output;
  ArrayInputStream raw_input;
  string data;
  TestOneof oneof_dest;
  CodedInputStream input;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_148;
  AssertHelper local_140;
  uint local_138 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  string local_128;
  undefined1 local_108 [32];
  string local_e8;
  TestOneof local_c8;
  undefined1 local_a8 [24];
  uint8_t local_90 [16];
  uint8_t local_80 [8];
  undefined8 local_78;
  uint local_70;
  DescriptorPool *local_68;
  MessageFactory *pMStack_60;
  undefined1 local_50 [56];
  
  proto2_unittest::TestOneofBackwardsCompatible::TestOneofBackwardsCompatible
            ((TestOneofBackwardsCompatible *)local_50,(Arena *)0x0);
  proto2_unittest::TestOneof::TestOneof(&local_c8,(Arena *)0x0);
  local_50._48_4_ = 100;
  local_50[0x10] = local_50[0x10] | 9;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  if ((local_50._8_8_ & 1) != 0) {
    local_50._8_8_ = *(undefined8 *)(local_50._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "101";
  value._M_len = 3;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  ArenaStringPtr::Set((ArenaStringPtr *)(local_50 + 0x18),value,(Arena *)local_50._8_8_);
  io::StringOutputStream::StringOutputStream((StringOutputStream *)&local_128,&local_e8);
  pDVar1 = (DescriptorPool *)(local_a8 + 0x10);
  local_70 = (uint)(uint3)((io::CodedOutputStream::default_serialization_deterministic_ & 1) << 0x10
                          );
  local_a8._0_8_ = pDVar1;
  local_a8._8_8_ = pDVar1;
  local_78 = &local_128;
  local_68 = pDVar1;
  pMStack_60 = (MessageFactory *)io::StringOutputStream::ByteCount((StringOutputStream *)&local_128)
  ;
  bVar3 = io::StringOutputStream::Next
                    ((StringOutputStream *)&local_128,(void **)local_108,(int *)local_138);
  if (bVar3 && 0 < (int)local_138[0]) {
    pDVar2 = (DescriptorPool *)(local_108._0_8_ + -0x10);
    if ((int)local_138[0] < 0x11) {
      pDVar2 = pDVar1;
    }
    local_a8._0_8_ =
         (long)&(pDVar2->field_memo_table_mutex_).mu_.super___atomic_base<long>._M_i +
         (ulong)local_138[0];
    local_a8._8_8_ = local_108._0_8_;
    local_68 = pDVar1;
    if (0x10 < (int)local_138[0]) {
      local_a8._8_8_ = (DescriptorPool *)0x0;
      local_68 = (DescriptorPool *)local_108._0_8_;
    }
  }
  sVar4 = proto2_unittest::TestOneofBackwardsCompatible::ByteSizeLong
                    ((TestOneofBackwardsCompatible *)local_50);
  WireFormat::SerializeWithCachedSizes((Message *)local_50,(int)sVar4,(CodedOutputStream *)local_a8)
  ;
  bVar3 = io::CodedOutputStream::HadError((CodedOutputStream *)local_a8);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_138[0]._0_1_ = (internal)!bVar3;
  if (bVar3) {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_138,(AssertionResult *)0x124afed,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x128,(char *)local_108._0_8_);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (local_148._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_148._M_head_impl + 8))();
    }
    if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_130,local_130);
    }
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_a8);
  }
  else {
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_a8);
    io::ArrayInputStream::ArrayInputStream
              ((ArrayInputStream *)local_108,local_e8._M_dataplus._M_p,
               (int)local_e8._M_string_length,-1);
    local_a8._0_8_ = (DescriptorPool *)0x0;
    local_a8._8_8_ = (DescriptorPool *)0x0;
    local_90[0] = '\0';
    local_90[1] = '\0';
    local_90[2] = '\0';
    local_90[3] = '\0';
    local_90[4] = '\0';
    local_90[5] = '\0';
    local_90[6] = '\0';
    local_90[7] = '\0';
    local_90[8] = '\0';
    local_90[9] = '\0';
    local_90[10] = '\0';
    local_90[0xb] = '\0';
    local_90[0xc] = '\0';
    local_90[0xd] = '\0';
    local_90[0xe] = '\0';
    local_80[0] = 0xff;
    local_80[1] = 0xff;
    local_80[2] = 0xff;
    local_80[3] = '\x7f';
    local_80[4] = '\0';
    local_80[5] = '\0';
    local_80[6] = '\0';
    local_80[7] = '\0';
    local_78 = (string *)CONCAT44(io::CodedInputStream::default_recursion_limit_,0x7fffffff);
    local_70 = io::CodedInputStream::default_recursion_limit_;
    local_68 = (DescriptorPool *)0x0;
    pMStack_60 = (MessageFactory *)0x0;
    local_a8._16_8_ = (ArrayInputStream *)local_108;
    io::CodedInputStream::Refresh((CodedInputStream *)local_a8);
    WireFormat::ParseAndMergePartial((CodedInputStream *)local_a8,&local_c8.super_Message);
    local_138[0] = CONCAT31(local_138[0]._1_3_,local_c8.field_0._impl_._oneof_case_[0] != 1);
    local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_c8.field_0._impl_._oneof_case_[0] == 1) {
      testing::Message::Message((Message *)&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_128,(internal *)local_138,(AssertionResult *)"oneof_dest.has_foo_int()",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x12f,local_128._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (local_148._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_148._M_head_impl + 8))();
      }
    }
    if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_130,local_130);
    }
    iVar5 = (internal)(local_c8.field_0._impl_._oneof_case_[0] == 2);
    local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_138[0]._0_1_ = iVar5;
    if (!(bool)iVar5) {
      testing::Message::Message((Message *)&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_128,(internal *)local_138,(AssertionResult *)"oneof_dest.has_foo_string()",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x130,local_128._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (local_148._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_148._M_head_impl + 8))();
      }
    }
    if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_130,local_130);
    }
    io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  proto2_unittest::TestOneof::~TestOneof(&local_c8);
  proto2_unittest::TestOneofBackwardsCompatible::~TestOneofBackwardsCompatible
            ((TestOneofBackwardsCompatible *)local_50);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, OneofOnlySetLast) {
  typename TestFixture::TestOneofBackwardsCompatible source;
  typename TestFixture::TestOneof oneof_dest;
  std::string data;

  // Set two fields
  source.set_foo_int(100);
  source.set_foo_string("101");

  // Serialize and parse to oneof message. Generated serializer may not order
  // fields in tag order. Use WireFormat::SerializeWithCachedSizes instead as
  // it sorts fields beforehand.
  {
    io::StringOutputStream raw_output(&data);
    io::CodedOutputStream output(&raw_output);
    WireFormat::SerializeWithCachedSizes(source, source.ByteSizeLong(),
                                         &output);
    ASSERT_FALSE(output.HadError());
  }
  io::ArrayInputStream raw_input(data.data(), data.size());
  io::CodedInputStream input(&raw_input);
  WireFormat::ParseAndMergePartial(&input, &oneof_dest);

  // Only the last field is set.
  EXPECT_FALSE(oneof_dest.has_foo_int());
  EXPECT_TRUE(oneof_dest.has_foo_string());
}